

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void real_suite::fail_as_int(void)

{
  char input [4];
  decoder_type decoder;
  value_type local_184 [4];
  double local_180 [4];
  undefined8 local_160;
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_184 + 3;
  builtin_memcpy(local_184,"1.0",4);
  local_158.input.head = local_184;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_180[0] = (double)CONCAT44(local_180[0]._4_4_,local_158.current.code);
  local_160 = CONCAT44(local_160._4_4_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5b3,"void real_suite::fail_as_int()",local_180,&local_160);
  local_180[0] = trial::protocol::json::detail::basic_decoder<char>::real_value<double>(&local_158);
  local_160 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("decoder.real_value<double>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5b4,"void real_suite::fail_as_int()",local_180,&local_160);
  trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&local_158);
  boost::detail::throw_failed_impl
            ("decoder.signed_value<int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5b6,"void real_suite::fail_as_int()");
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}